

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O0

skynet_context * skynet_context_new(char *name,char *param)

{
  uint32_t uVar1;
  int iVar2;
  skynet_module *m;
  void *inst_00;
  skynet_context *ctx_00;
  message_queue *q;
  char *local_70;
  uint32_t local_58;
  uint32_t local_54;
  drop_t d;
  uint32_t handle;
  skynet_context *ret;
  int r;
  message_queue *queue;
  skynet_context *ctx;
  void *inst;
  skynet_module *mod;
  char *param_local;
  char *name_local;
  
  m = skynet_module_query(name);
  if (m == (skynet_module *)0x0) {
    name_local = (char *)0x0;
  }
  else {
    inst_00 = skynet_module_instance_create(m);
    if (inst_00 == (void *)0x0) {
      name_local = (char *)0x0;
    }
    else {
      ctx_00 = (skynet_context *)malloc(0x60);
      ctx_00->mod = m;
      ctx_00->instance = inst_00;
      ctx_00->ref = 2;
      ctx_00->cb = (skynet_cb)0x0;
      ctx_00->cb_ud = (void *)0x0;
      ctx_00->session_id = 0;
      ctx_00->logfile = (FILE *)0x0;
      ctx_00->init = false;
      ctx_00->endless = false;
      ctx_00->handle = 0;
      uVar1 = skynet_handle_register(ctx_00);
      ctx_00->handle = uVar1;
      q = skynet_mq_create(ctx_00->handle);
      ctx_00->queue = q;
      context_inc();
      iVar2 = skynet_module_instance_init(m,inst_00,ctx_00,param);
      if (iVar2 == 0) {
        _d = skynet_context_release(ctx_00);
        if (_d != (skynet_context *)0x0) {
          ctx_00->init = true;
        }
        skynet_globalmq_push(q);
        if (_d != (skynet_context *)0x0) {
          local_70 = param;
          if (param == (char *)0x0) {
            local_70 = "";
          }
          skynet_error(_d,"LAUNCH %s %s",name,local_70);
        }
        name_local = (char *)_d;
      }
      else {
        skynet_error(ctx_00,"FAILED launch %s",name);
        local_54 = ctx_00->handle;
        skynet_context_release(ctx_00);
        skynet_handle_retire(local_54);
        local_58 = local_54;
        skynet_mq_release(q,drop_message,&local_58);
        name_local = (char *)0x0;
      }
    }
  }
  return (skynet_context *)name_local;
}

Assistant:

struct skynet_context * 
skynet_context_new(const char * name, const char *param) {
	struct skynet_module * mod = skynet_module_query(name);

	if (mod == NULL)
		return NULL;

	void *inst = skynet_module_instance_create(mod);
	if (inst == NULL)
		return NULL;
	struct skynet_context * ctx = skynet_malloc(sizeof(*ctx));
	CHECKCALLING_INIT(ctx)

	ctx->mod = mod;
	ctx->instance = inst;
	ctx->ref = 2;
	ctx->cb = NULL;
	ctx->cb_ud = NULL;
	ctx->session_id = 0;
	ctx->logfile = NULL;

	ctx->init = false;
	ctx->endless = false;
	// Should set to 0 first to avoid skynet_handle_retireall get an uninitialized handle
	ctx->handle = 0;	
	ctx->handle = skynet_handle_register(ctx);
	struct message_queue * queue = ctx->queue = skynet_mq_create(ctx->handle);
	// init function maybe use ctx->handle, so it must init at last
	context_inc();

	CHECKCALLING_BEGIN(ctx)
	int r = skynet_module_instance_init(mod, inst, ctx, param);
	CHECKCALLING_END(ctx)
	if (r == 0) {
		struct skynet_context * ret = skynet_context_release(ctx);
		if (ret) {
			ctx->init = true;
		}
		skynet_globalmq_push(queue);
		if (ret) {
			skynet_error(ret, "LAUNCH %s %s", name, param ? param : "");
		}
		return ret;
	} else {
		skynet_error(ctx, "FAILED launch %s", name);
		uint32_t handle = ctx->handle;
		skynet_context_release(ctx);
		skynet_handle_retire(handle);
		struct drop_t d = { handle };
		skynet_mq_release(queue, drop_message, &d);
		return NULL;
	}
}